

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderStateQueryTests.cpp
# Opt level: O3

void __thiscall
deqp::gles3::Functional::anon_unknown_0::VertexAttributeSizeCase::test
          (VertexAttributeSizeCase *this)

{
  CallLogWrapper *this_00;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  TestLog *pTVar3;
  GLenum GVar4;
  long lVar5;
  ScopedLogSection section;
  GLuint vaos [2];
  GLuint buf;
  PointerData pointers [8];
  GLfloat vertexData [4];
  ScopedLogSection local_140;
  string local_138;
  string local_118;
  GLenum local_f8 [2];
  GLsizei local_f0;
  byte local_ec [4];
  undefined8 *local_e8;
  undefined8 local_e0;
  GLsizei local_d8;
  byte local_d4;
  undefined8 *local_d0;
  undefined8 local_c8;
  undefined4 local_c0;
  undefined1 local_bc;
  undefined8 *local_b8;
  undefined8 local_b0;
  undefined4 local_a8;
  undefined1 local_a4;
  undefined8 *local_a0;
  undefined8 local_98;
  undefined4 local_90;
  undefined1 local_8c;
  undefined8 *local_88;
  undefined8 local_80;
  undefined4 local_78;
  undefined1 local_74;
  undefined8 *local_70;
  undefined8 local_68;
  undefined4 local_60;
  undefined1 local_5c;
  undefined8 *local_58;
  undefined8 local_50;
  undefined4 local_48;
  undefined1 local_44;
  undefined8 *local_40;
  undefined8 local_38;
  undefined8 uStack_30;
  
  local_e8 = &local_38;
  local_38 = 0;
  uStack_30 = 0;
  local_f8[0] = 4;
  local_f8[1] = 0x1406;
  local_f0 = 0;
  local_ec[0] = 0;
  local_e0 = 0x140600000003;
  local_d8 = 0;
  local_d4 = 0;
  local_c8 = 0x140600000002;
  local_c0 = 0;
  local_bc = 0;
  local_b0 = 0x140600000001;
  local_a8 = 0;
  local_a4 = 0;
  local_98 = 0x140400000004;
  local_90 = 0;
  local_8c = 0;
  local_80 = 0x140400000003;
  local_78 = 0;
  local_74 = 0;
  local_68 = 0x140400000002;
  local_60 = 0;
  local_5c = 0;
  local_50 = 0x140400000001;
  local_48 = 0;
  local_44 = 0;
  pTVar3 = (this->super_ApiCase).m_log;
  paVar1 = &local_138.field_2;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  local_d0 = local_e8;
  local_b8 = local_e8;
  local_a0 = local_e8;
  local_88 = local_e8;
  local_70 = local_e8;
  local_58 = local_e8;
  local_40 = local_e8;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"DefaultVAO","");
  paVar2 = &local_118.field_2;
  local_118._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Test with default VAO","");
  tcu::ScopedLogSection::ScopedLogSection(&local_140,pTVar3,&local_138,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  this_00 = &(this->super_ApiCase).super_CallLogWrapper;
  lVar5 = 0;
  do {
    GVar4 = (GLenum)local_ec[lVar5];
    glu::CallLogWrapper::glVertexAttribPointer
              (this_00,0,*(GLint *)((long)local_f8 + lVar5),*(GLenum *)((long)local_f8 + lVar5 + 4),
               local_ec[lVar5],*(GLsizei *)(local_ec + lVar5 + -4),
               *(void **)((long)&local_e8 + lVar5));
    ApiCase::expectError(&this->super_ApiCase,0);
    verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                       this_00,0x8623,*(GLenum *)((long)local_f8 + lVar5),GVar4);
    lVar5 = lVar5 + 0x18;
  } while (lVar5 != 0xc0);
  tcu::TestLog::endSection(local_140.m_log);
  pTVar3 = (this->super_ApiCase).m_log;
  local_138._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_138,"WithVAO","");
  local_118._M_dataplus._M_p = (pointer)paVar2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_118,"Test with VAO","");
  tcu::ScopedLogSection::ScopedLogSection(&local_140,pTVar3,&local_138,&local_118);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != paVar2) {
    operator_delete(local_118._M_dataplus._M_p,local_118.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != paVar1) {
    operator_delete(local_138._M_dataplus._M_p,local_138.field_2._M_allocated_capacity + 1);
  }
  local_118._M_dataplus._M_p = local_118._M_dataplus._M_p & 0xffffffff00000000;
  local_138._M_dataplus._M_p = (pointer)0x0;
  glu::CallLogWrapper::glGenVertexArrays(this_00,2,(GLuint *)&local_138);
  glu::CallLogWrapper::glGenBuffers(this_00,1,(GLuint *)&local_118);
  glu::CallLogWrapper::glBindBuffer(this_00,0x8892,(GLuint)local_118._M_dataplus._M_p);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,(GLuint)local_138._M_dataplus._M_p);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,0x8623,4,GVar4);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glVertexAttribPointer
            (this_00,0,local_f8[0],local_f8[1],local_ec[0],local_f0,(void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,local_138._M_dataplus._M_p._4_4_);
  GVar4 = (GLenum)local_d4;
  glu::CallLogWrapper::glVertexAttribPointer
            (this_00,0,(GLenum)local_e0,local_e0._4_4_,local_d4,local_d8,(void *)0x0);
  ApiCase::expectError(&this->super_ApiCase,0);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,0x8623,(GLenum)local_e0,GVar4);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glBindVertexArray(this_00,(GLuint)local_138._M_dataplus._M_p);
  verifyVertexAttrib((this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,
                     this_00,0x8623,local_f8[0],GVar4);
  ApiCase::expectError(&this->super_ApiCase,0);
  glu::CallLogWrapper::glDeleteVertexArrays(this_00,2,(GLuint *)&local_138);
  glu::CallLogWrapper::glDeleteBuffers(this_00,1,(GLuint *)&local_118);
  ApiCase::expectError(&this->super_ApiCase,0);
  tcu::TestLog::endSection(local_140.m_log);
  return;
}

Assistant:

void test (void)
	{
		GLfloat vertexData[4] = {0.0f}; // never accessed

		const PointerData pointers[] =
		{
			// size test
			{ 4, GL_FLOAT,		0,	GL_FALSE, vertexData },
			{ 3, GL_FLOAT,		0,	GL_FALSE, vertexData },
			{ 2, GL_FLOAT,		0,	GL_FALSE, vertexData },
			{ 1, GL_FLOAT,		0,	GL_FALSE, vertexData },
			{ 4, GL_INT,		0,	GL_FALSE, vertexData },
			{ 3, GL_INT,		0,	GL_FALSE, vertexData },
			{ 2, GL_INT,		0,	GL_FALSE, vertexData },
			{ 1, GL_INT,		0,	GL_FALSE, vertexData },
		};

		// Test with default VAO
		{
			const tcu::ScopedLogSection section(m_log, "DefaultVAO", "Test with default VAO");

			for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(pointers); ++ndx)
			{
				glVertexAttribPointer(0, pointers[ndx].size, pointers[ndx].type, pointers[ndx].normalized, pointers[ndx].stride, pointers[ndx].pointer);
				expectError(GL_NO_ERROR);

				verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_SIZE, pointers[ndx].size);
			}
		}

		// Test with multiple VAOs
		{
			const tcu::ScopedLogSection section(m_log, "WithVAO", "Test with VAO");

			GLuint buf		= 0;
			GLuint vaos[2]	= {0};

			glGenVertexArrays(2, vaos);
			glGenBuffers(1, &buf);
			glBindBuffer(GL_ARRAY_BUFFER, buf);
			expectError(GL_NO_ERROR);

			// initial
			glBindVertexArray(vaos[0]);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_SIZE, 4);
			expectError(GL_NO_ERROR);

			// set vao 0 to some value
			glVertexAttribPointer(0, pointers[0].size, pointers[0].type, pointers[0].normalized, pointers[0].stride, DE_NULL);
			expectError(GL_NO_ERROR);

			// set vao 1 to some other value
			glBindVertexArray(vaos[1]);
			glVertexAttribPointer(0, pointers[1].size, pointers[1].type, pointers[1].normalized, pointers[1].stride, DE_NULL);
			expectError(GL_NO_ERROR);

			// verify vao 1 state
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_SIZE, pointers[1].size);
			expectError(GL_NO_ERROR);

			// verify vao 0 state
			glBindVertexArray(vaos[0]);
			verifyVertexAttrib(m_testCtx, *this, 0, GL_VERTEX_ATTRIB_ARRAY_SIZE, pointers[0].size);
			expectError(GL_NO_ERROR);

			glDeleteVertexArrays(2, vaos);
			glDeleteBuffers(1, &buf);
			expectError(GL_NO_ERROR);
		}
	}